

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

HashElem * findElementWithHash(Hash *pH,char *pKey,uint *pHash)

{
  HashElem *pHVar1;
  ulong uVar2;
  uint uVar3;
  byte *pbVar4;
  uint uVar5;
  Hash *pHVar6;
  long lVar7;
  byte bVar8;
  
  if (pH->ht == (_ht *)0x0) {
    pHVar6 = (Hash *)&pH->count;
    uVar3 = 0;
  }
  else {
    bVar8 = *pKey;
    if (bVar8 == 0) {
      uVar3 = 0;
    }
    else {
      pbVar4 = (byte *)(pKey + 1);
      uVar3 = 0;
      do {
        uVar3 = (""[bVar8] + uVar3) * -0x61c8864f;
        bVar8 = *pbVar4;
        pbVar4 = pbVar4 + 1;
      } while (bVar8 != 0);
    }
    uVar2 = (ulong)uVar3 % (ulong)pH->htsize;
    uVar3 = (uint)uVar2;
    pH = (Hash *)(pH->ht + uVar2);
    pHVar6 = pH;
  }
  uVar5 = pHVar6->htsize;
  pHVar1 = pH->first;
  if (pHash != (uint *)0x0) {
    *pHash = uVar3;
  }
joined_r0x0015b144:
  if (uVar5 == 0) {
    return &findElementWithHash::nullElement;
  }
  lVar7 = 0;
  do {
    bVar8 = pHVar1->pKey[lVar7];
    if (bVar8 == pKey[lVar7]) {
      if ((ulong)bVar8 == 0) {
        return pHVar1;
      }
    }
    else if (""[bVar8] != ""[(byte)pKey[lVar7]]) break;
    lVar7 = lVar7 + 1;
  } while( true );
  pHVar1 = pHVar1->next;
  uVar5 = uVar5 - 1;
  goto joined_r0x0015b144;
}

Assistant:

static HashElem *findElementWithHash(
  const Hash *pH,     /* The pH to be searched */
  const char *pKey,   /* The key we are searching for */
  unsigned int *pHash /* Write the hash value here */
){
  HashElem *elem;                /* Used to loop thru the element list */
  unsigned int count;            /* Number of elements left to test */
  unsigned int h;                /* The computed hash */
  static HashElem nullElement = { 0, 0, 0, 0 };

  if( pH->ht ){   /*OPTIMIZATION-IF-TRUE*/
    struct _ht *pEntry;
    h = strHash(pKey) % pH->htsize;
    pEntry = &pH->ht[h];
    elem = pEntry->chain;
    count = pEntry->count;
  }else{
    h = 0;
    elem = pH->first;
    count = pH->count;
  }
  if( pHash ) *pHash = h;
  while( count ){
    assert( elem!=0 );
    if( sqlite3StrICmp(elem->pKey,pKey)==0 ){
      return elem;
    }
    elem = elem->next;
    count--;
  }
  return &nullElement;
}